

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O2

void P_SpawnPushers(void)

{
  int iVar1;
  AActor *pAVar2;
  PClass *pPVar3;
  DPusher *pDVar4;
  int iVar5;
  line_t_conflict *plVar6;
  line_t_conflict *plVar7;
  FSectorTagIterator itr;
  
  iVar5 = 0;
  plVar7 = lines;
  do {
    if (numlines <= iVar5) {
      return;
    }
    iVar1 = plVar7->special;
    if (iVar1 == 0xe3) {
      itr.searchtag = plVar7->args[0];
      if (itr.searchtag == 0) {
        itr.searchtag = 0;
        itr.start = 0;
        while (pAVar2 = FActorIterator::Next((FActorIterator *)&itr), pAVar2 != (AActor *)0x0) {
          pPVar3 = DObject::GetClass((DObject *)pAVar2);
          if (((pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index == 0x3c)
             || (pPVar3 = DObject::GetClass((DObject *)pAVar2),
                (pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index == 0x3d)
             ) {
            pDVar4 = (DPusher *)DObject::operator_new(0x70);
            plVar6 = (line_t_conflict *)0x0;
            if (plVar7->args[3] != 0) {
              plVar6 = plVar7;
            }
            DPusher::DPusher(pDVar4,p_push,(line_t *)plVar6,plVar7->args[2],0,pAVar2,
                             (int)(((long)pAVar2->Sector - (long)sectors) / 0x218));
          }
        }
      }
      else {
        itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
        while (iVar1 = FSectorTagIterator::Next(&itr), -1 < iVar1) {
          pAVar2 = P_GetPushThing(iVar1);
          if ((pAVar2 != (AActor *)0x0) &&
             ((plVar7->args[1] == 0 || (plVar7->args[1] == pAVar2->tid)))) {
            pDVar4 = (DPusher *)DObject::operator_new(0x70);
            plVar6 = (line_t_conflict *)0x0;
            if (plVar7->args[3] != 0) {
              plVar6 = plVar7;
            }
            DPusher::DPusher(pDVar4,p_push,(line_t *)plVar6,plVar7->args[2],0,pAVar2,iVar1);
          }
        }
      }
      plVar7->special = 0;
    }
    else {
      if (iVar1 == 0xdc) {
        itr.searchtag = plVar7->args[0];
        if (itr.searchtag == 0) {
          itr.start = 0;
        }
        else {
          itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
        }
        while (iVar1 = FSectorTagIterator::Next(&itr), -1 < iVar1) {
          pDVar4 = (DPusher *)DObject::operator_new(0x70);
          plVar6 = plVar7;
          if (plVar7->args[3] == 0) {
            plVar6 = (line_t_conflict *)0x0;
          }
          DPusher::DPusher(pDVar4,p_current,(line_t *)plVar6,plVar7->args[1],plVar7->args[2],
                           (AActor *)0x0,iVar1);
        }
      }
      else {
        if (iVar1 != 0xda) goto LAB_0043e3e2;
        itr.searchtag = plVar7->args[0];
        if (itr.searchtag == 0) {
          itr.start = 0;
        }
        else {
          itr.start = tagManager.TagHashFirst[(byte)itr.searchtag];
        }
        while (iVar1 = FSectorTagIterator::Next(&itr), -1 < iVar1) {
          pDVar4 = (DPusher *)DObject::operator_new(0x70);
          plVar6 = plVar7;
          if (plVar7->args[3] == 0) {
            plVar6 = (line_t_conflict *)0x0;
          }
          DPusher::DPusher(pDVar4,p_wind,(line_t *)plVar6,plVar7->args[1],plVar7->args[2],
                           (AActor *)0x0,iVar1);
        }
      }
      plVar7->special = 0;
    }
LAB_0043e3e2:
    iVar5 = iVar5 + 1;
    plVar7 = plVar7 + 1;
  } while( true );
}

Assistant:

void P_SpawnPushers ()
{
	int i;
	line_t *l = lines;
	int s;

	for (i = 0; i < numlines; i++, l++)
	{
		switch (l->special)
		{
		case Sector_SetWind: // wind
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_wind, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case Sector_SetCurrent: // current
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_current, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case PointPush_SetForce: // push/pull
			if (l->args[0]) {	// [RH] Find thing by sector
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					AActor *thing = P_GetPushThing (s);
					if (thing) {	// No MT_P* means no effect
						// [RH] Allow narrowing it down by tid
						if (!l->args[1] || l->args[1] == thing->tid)
							new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
										 0, thing, s);
					}
				}
			} else {	// [RH] Find thing by tid
				AActor *thing;
				FActorIterator iterator (l->args[1]);

				while ( (thing = iterator.Next ()) )
				{
					if (thing->GetClass()->TypeName == NAME_PointPusher ||
						thing->GetClass()->TypeName == NAME_PointPuller)
					{
						new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
									 0, thing, int(thing->Sector - sectors));
					}
				}
			}
			l->special = 0;
			break;
		}
	}
}